

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::Descriptor::GetLocationPath
          (Descriptor *this,vector<int,_std::allocator<int>_> *output)

{
  Descriptor **ppDVar1;
  int local_1c;
  
  if (this->containing_type_ == (Descriptor *)0x0) {
    local_1c = 4;
  }
  else {
    GetLocationPath(this->containing_type_,output);
    local_1c = 3;
  }
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,&local_1c);
  ppDVar1 = &this->file_->message_types_;
  if (this->containing_type_ != (Descriptor *)0x0) {
    ppDVar1 = &this->containing_type_->nested_types_;
  }
  local_1c = (int)(((long)this - (long)*ppDVar1) / 0xa0);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,&local_1c);
  return;
}

Assistant:

void Descriptor::GetLocationPath(std::vector<int>* output) const {
  if (containing_type()) {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kNestedTypeFieldNumber);
    output->push_back(index());
  } else {
    output->push_back(FileDescriptorProto::kMessageTypeFieldNumber);
    output->push_back(index());
  }
}